

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

char * ObsToString(pyhanabi_observation_t *observation)

{
  char *pcVar1;
  string str;
  string local_30;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x28c,"char *ObsToString(pyhanabi_observation_t *)");
  }
  if ((HanabiObservation *)observation->observation != (HanabiObservation *)0x0) {
    hanabi_learning_env::HanabiObservation::ToString_abi_cxx11_
              (&local_30,(HanabiObservation *)observation->observation);
    pcVar1 = strdup(local_30._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_30);
    return pcVar1;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x28d,"char *ObsToString(pyhanabi_observation_t *)");
}

Assistant:

char* ObsToString(pyhanabi_observation_t* observation) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  std::string str = reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
                        observation->observation)
                        ->ToString();
  return strdup(str.c_str());
}